

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

float __thiscall Assimp::XGLImporter::ReadFloat(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  float local_2c;
  char *pcStack_28;
  float t;
  char *se;
  char *s;
  XGLImporter *this_local;
  
  s = (char *)this;
  bVar1 = SkipToText(this);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar2 = (*peVar3->_vptr_IIrrXMLReader[0xe])();
    se = (char *)CONCAT44(extraout_var,iVar2);
    bVar1 = SkipSpaces<char>(&se);
    if (bVar1) {
      pcStack_28 = fast_atoreal_move<float>(se,&local_2c,true);
      if (pcStack_28 == se) {
        LogFunctions<Assimp::XGLImporter>::LogError("failed to read float text");
        this_local._4_4_ = 0.0;
      }
      else {
        this_local._4_4_ = local_2c;
      }
    }
    else {
      LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOL, failed to parse float");
      this_local._4_4_ = 0.0;
    }
  }
  else {
    LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOF reading float element contents");
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float XGLImporter::ReadFloat()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading float element contents");
        return 0.f;
    }
    const char* s = m_reader->getNodeData(), *se;

    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse float");
        return 0.f;
    }

    float t;
    se = fast_atoreal_move(s,t);

    if (se == s) {
        LogError("failed to read float text");
        return 0.f;
    }

    return t;
}